

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccpp.c
# Opt level: O0

int macro_subst_tok(TokenString *tok_str,Sym **nested_list,Sym *s)

{
  int iVar1;
  int iVar2;
  tm *ptVar3;
  Sym *pSVar4;
  char *pcVar5;
  int *str_00;
  bool bVar6;
  int *local_170;
  bool local_151;
  uint local_150;
  int local_14c;
  undefined1 auStack_148 [4];
  int i;
  TokenString ws_str;
  int *mstr;
  int *joined_str;
  int saved_parse_flags;
  tm *tm;
  time_t ti;
  char buf [32];
  undefined1 local_c0 [8];
  CString cstr;
  CValue cval;
  char *local_90;
  char *cstrval;
  TokenString str;
  int spc;
  int t1;
  int t;
  int parlevel;
  Sym *sa1;
  Sym *sa;
  Sym *args;
  Sym *s_local;
  Sym **nested_list_local;
  TokenString *tok_str_local;
  
  iVar1 = parse_flags;
  args = s;
  s_local = (Sym *)nested_list;
  nested_list_local = (Sym **)tok_str;
  if ((tok == 0x147) || (tok == 0x14d)) {
    if (tok == 0x147) {
      local_150 = file->line_num;
    }
    else {
      local_150 = pp_counter;
      pp_counter = pp_counter + 1;
    }
    snprintf((char *)&ti,0x20,"%d",(ulong)local_150);
    local_90 = (char *)&ti;
    str._52_4_ = 0xbe;
  }
  else {
    if (tok == 0x148) {
      local_90 = file->filename;
    }
    else {
      if ((tok != 0x149) && (tok != 0x14a)) {
        if ((s->field_3).enum_val == 0) {
          return 0;
        }
        ws_str._48_8_ = s->field_3;
        if ((s->type).t == 1) {
          tok_str_new((TokenString *)auStack_148);
          str.alloc = '\0';
          str._49_3_ = 0;
          parse_flags = parse_flags | 0x34;
          iVar2 = next_argstream((Sym **)s_local,(TokenString *)auStack_148);
          if (iVar2 != 0x28) {
            parse_flags = iVar1;
            tok_str_add((TokenString *)nested_list_local,tok);
            if ((parse_flags & 0x10U) != 0) {
              for (local_14c = 0; local_14c < (int)ws_str.str; local_14c = local_14c + 1) {
                tok_str_add((TokenString *)nested_list_local,_auStack_148[local_14c]);
              }
            }
            tok_str_free_str(_auStack_148);
            return 0;
          }
          tok_str_free_str(_auStack_148);
          do {
            next_nomacro();
          } while (tok == 0xcb);
          sa = (Sym *)0x0;
          sa1 = (args->field_5).next;
          do {
            do {
              next_argstream((Sym **)s_local,(TokenString *)0x0);
              iVar2 = is_space(tok);
              local_151 = iVar2 != 0 || tok == 10;
            } while (local_151);
LAB_0012b487:
            if (((sa == (Sym *)0x0) && (sa1 == (Sym *)0x0)) && (tok == 0x29)) goto LAB_0012b6b5;
            if (sa1 == (Sym *)0x0) {
              pcVar5 = get_tok_str(args->v,(CValue *)0x0);
              tcc_error("macro \'%s\' used with too many args",pcVar5);
            }
            tok_str_new((TokenString *)&cstrval);
            str.alloc = '\0';
            str._49_3_ = 0;
            t1 = 0;
            while( true ) {
              bVar6 = true;
              if (((t1 < 1) && (bVar6 = false, tok != 0x29)) && (bVar6 = true, tok == 0x2c)) {
                bVar6 = (sa1->type).t != 0;
              }
              if (((!bVar6) || (tok == -1)) || (tok == 0)) break;
              if (tok == 0x28) {
                t1 = t1 + 1;
              }
              else if (tok == 0x29) {
                t1 = t1 + -1;
              }
              if (tok == 10) {
                tok = 0x20;
              }
              iVar2 = check_space(tok,(int *)&str.alloc);
              if (iVar2 == 0) {
                tok_str_add2((TokenString *)&cstrval,tok,&tokc);
              }
              next_argstream((Sym **)s_local,(TokenString *)0x0);
            }
            if (t1 != 0) {
              expect(")");
            }
            str.str._0_4_ = (int)str.str - str._48_4_;
            tok_str_add((TokenString *)&cstrval,-1);
            tok_str_add((TokenString *)&cstrval,0);
            pSVar4 = sym_push2(&sa,sa1->v & 0xdfffffff,(sa1->type).t,0);
            (pSVar4->field_3).d = (int *)cstrval;
            sa1 = (sa1->field_5).next;
            if (tok == 0x29) goto code_r0x0012b674;
            if (tok != 0x2c) {
              expect(",");
            }
          } while( true );
        }
        goto LAB_0012b76c;
      }
      time((time_t *)&tm);
      ptVar3 = localtime((time_t *)&tm);
      if (tok == 0x149) {
        snprintf((char *)&ti,0x20,"%s %2d %d",ab_month_name + ptVar3->tm_mon,
                 (ulong)(uint)ptVar3->tm_mday,(ulong)(ptVar3->tm_year + 0x76c));
      }
      else {
        snprintf((char *)&ti,0x20,"%02d:%02d:%02d",(ulong)(uint)ptVar3->tm_hour,
                 (ulong)(uint)ptVar3->tm_min,(ulong)(uint)ptVar3->tm_sec);
      }
      local_90 = (char *)&ti;
    }
    str._52_4_ = 0xb9;
  }
  cstr_new((CString *)local_c0);
  cstr_cat((CString *)local_c0,local_90,0);
  cstr.size_allocated = local_c0._0_4_;
  tok_str_add2((TokenString *)nested_list_local,str._52_4_,(CValue *)&cstr.size_allocated);
  cstr_free((CString *)local_c0);
  return 0;
code_r0x0012b674:
  if (((sa1 != (Sym *)0x0) && ((sa1->type).t != 0)) && (gnu_ext != 0)) goto LAB_0012b487;
LAB_0012b6b5:
  if (sa1 != (Sym *)0x0) {
    pcVar5 = get_tok_str(args->v,(CValue *)0x0);
    tcc_error("macro \'%s\' used with too few args",pcVar5);
  }
  parse_flags = iVar1;
  ws_str._48_8_ = macro_arg_subst((Sym **)s_local,(int *)ws_str._48_8_,sa);
  sa1 = sa;
  while (sa1 != (Sym *)0x0) {
    pSVar4 = sa1->prev;
    tok_str_free_str((sa1->field_3).d);
    if ((sa1->field_5).next != (Sym *)0x0) {
      tok_str_free_str((((sa1->field_5).next)->field_3).d);
      sym_free((sa1->field_5).next);
    }
    sym_free(sa1);
    sa1 = pSVar4;
  }
LAB_0012b76c:
  sym_push2((Sym **)s_local,args->v,0,0);
  parse_flags = iVar1;
  str_00 = macro_twosharps((int *)ws_str._48_8_);
  local_170 = str_00;
  if (str_00 == (int *)0x0) {
    local_170 = (int *)ws_str._48_8_;
  }
  macro_subst((TokenString *)nested_list_local,(Sym **)s_local,local_170);
  pSVar4 = *(Sym **)s_local;
  *(Sym **)s_local = pSVar4->prev;
  sym_free(pSVar4);
  if (str_00 != (int *)0x0) {
    tok_str_free_str(str_00);
  }
  if (ws_str._48_8_ != (args->field_3).enum_val) {
    tok_str_free_str((int *)ws_str._48_8_);
  }
  return 0;
}

Assistant:

static int macro_subst_tok(TokenString* tok_str, Sym** nested_list, Sym* s) {
  Sym *args, *sa, *sa1;
  int parlevel, t, t1, spc;
  TokenString str;
  char* cstrval;
  CValue cval;
  CString cstr;
  char buf[32];

  /* if symbol is a macro, prepare substitution */
  /* special macros */
  if (tok == TOK___LINE__ || tok == TOK___COUNTER__) {
    t = tok == TOK___LINE__ ? file->line_num : pp_counter++;
    snprintf(buf, sizeof(buf), "%d", t);
    cstrval = buf;
    t1 = TOK_PPNUM;
    goto add_cstr1;
  } else if (tok == TOK___FILE__) {
    cstrval = file->filename;
    goto add_cstr;
  } else if (tok == TOK___DATE__ || tok == TOK___TIME__) {
    time_t ti;
    struct tm* tm;

    time(&ti);
    tm = localtime(&ti);
    if (tok == TOK___DATE__) {
      snprintf(buf, sizeof(buf), "%s %2d %d", ab_month_name[tm->tm_mon], tm->tm_mday, tm->tm_year + 1900);
    } else {
      snprintf(buf, sizeof(buf), "%02d:%02d:%02d", tm->tm_hour, tm->tm_min, tm->tm_sec);
    }
    cstrval = buf;
  add_cstr:
    t1 = TOK_STR;
  add_cstr1:
    cstr_new(&cstr);
    cstr_cat(&cstr, cstrval, 0);
    cval.str.size = cstr.size;
    cval.str.data = cstr.data;
    tok_str_add2(tok_str, t1, &cval);
    cstr_free(&cstr);
  } else if (s->d) {
    int saved_parse_flags = parse_flags;
    int* joined_str = NULL;
    int* mstr = s->d;

    if (s->type.t == MACRO_FUNC) {
      /* whitespace between macro name and argument list */
      TokenString ws_str;
      tok_str_new(&ws_str);

      spc = 0;
      parse_flags |= PARSE_FLAG_SPACES | PARSE_FLAG_LINEFEED | PARSE_FLAG_ACCEPT_STRAYS;

      /* get next token from argument stream */
      t = next_argstream(nested_list, &ws_str);
      if (t != '(') {
        /* not a macro substitution after all, restore the
         * macro token plus all whitespace we've read.
         * whitespace is intentionally not merged to preserve
         * newlines. */
        parse_flags = saved_parse_flags;
        tok_str_add(tok_str, tok);
        if (parse_flags & PARSE_FLAG_SPACES) {
          int i;
          for (i = 0; i < ws_str.len; i++)
            tok_str_add(tok_str, ws_str.str[i]);
        }
        tok_str_free_str(ws_str.str);
        return 0;
      } else {
        tok_str_free_str(ws_str.str);
      }
      do {
        next_nomacro(); /* eat '(' */
      } while (tok == TOK_PLCHLDR);

      /* argument macro */
      args = NULL;
      sa = s->next;
      /* NOTE: empty args are allowed, except if no args */
      for (;;) {
        do {
          next_argstream(nested_list, NULL);
        } while (is_space(tok) || TOK_LINEFEED == tok);
      empty_arg:
        /* handle '()' case */
        if (!args && !sa && tok == ')')
          break;
        if (!sa)
          tcc_error("macro '%s' used with too many args", get_tok_str(s->v, 0));
        tok_str_new(&str);
        parlevel = spc = 0;
        /* NOTE: non zero sa->t indicates VA_ARGS */
        while ((parlevel > 0 || (tok != ')' && (tok != ',' || sa->type.t)))) {
          if (tok == TOK_EOF || tok == 0)
            break;
          if (tok == '(')
            parlevel++;
          else if (tok == ')')
            parlevel--;
          if (tok == TOK_LINEFEED)
            tok = ' ';
          if (!check_space(tok, &spc))
            tok_str_add2(&str, tok, &tokc);
          next_argstream(nested_list, NULL);
        }
        if (parlevel)
          expect(")");
        str.len -= spc;
        tok_str_add(&str, -1);
        tok_str_add(&str, 0);
        sa1 = sym_push2(&args, sa->v & ~SYM_FIELD, sa->type.t, 0);
        sa1->d = str.str;
        sa = sa->next;
        if (tok == ')') {
          /* special case for gcc var args: add an empty
             var arg argument if it is omitted */
          if (sa && sa->type.t && gnu_ext)
            goto empty_arg;
          break;
        }
        if (tok != ',')
          expect(",");
      }
      if (sa) {
        tcc_error("macro '%s' used with too few args", get_tok_str(s->v, 0));
      }

      parse_flags = saved_parse_flags;

      /* now subst each arg */
      mstr = macro_arg_subst(nested_list, mstr, args);
      /* free memory */
      sa = args;
      while (sa) {
        sa1 = sa->prev;
        tok_str_free_str(sa->d);
        if (sa->next) {
          tok_str_free_str(sa->next->d);
          sym_free(sa->next);
        }
        sym_free(sa);
        sa = sa1;
      }
    }

    sym_push2(nested_list, s->v, 0, 0);
    parse_flags = saved_parse_flags;
    joined_str = macro_twosharps(mstr);
    macro_subst(tok_str, nested_list, joined_str ? joined_str : mstr);

    /* pop nested defined symbol */
    sa1 = *nested_list;
    *nested_list = sa1->prev;
    sym_free(sa1);
    if (joined_str)
      tok_str_free_str(joined_str);
    if (mstr != s->d)
      tok_str_free_str(mstr);
  }
  return 0;
}